

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_alloc.c
# Opt level: O0

size_t release_unused_segments(mstate m)

{
  void *__addr;
  size_t __len;
  malloc_segment *pmVar1;
  malloc_tree_chunk *pmVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  tbinptr pmVar6;
  ulong uVar7;
  malloc_tree_chunk *pmVar8;
  size_t *psVar9;
  bool bVar10;
  size_t local_110;
  ulong local_e8;
  tchunkptr F_1;
  tchunkptr *C;
  size_t K_1;
  tchunkptr T;
  uint K;
  uint X;
  bindex_t I;
  tbinptr *H_1;
  tchunkptr C1;
  tchunkptr C0;
  tbinptr *H;
  tchunkptr *CP;
  tchunkptr *RP;
  tchunkptr F;
  tchunkptr R;
  tchunkptr XP;
  tchunkptr tp;
  size_t psize;
  mchunkptr p;
  msegmentptr next;
  size_t size;
  char *base;
  msegmentptr sp;
  msegmentptr pred;
  size_t sStack_18;
  int nsegs;
  size_t released;
  mstate m_local;
  
  sStack_18 = 0;
  pred._4_4_ = 0;
  sp = &m->seg;
  base = (char *)(m->seg).next;
  do {
    if (base == (char *)0x0) {
      if (pred._4_4_ < 0x1000) {
        local_110 = 0xfff;
      }
      else {
        local_110 = (size_t)(int)pred._4_4_;
      }
      m->release_checks = local_110;
      return sStack_18;
    }
    __addr = *(void **)base;
    __len = *(size_t *)(base + 8);
    pmVar1 = *(malloc_segment **)(base + 0x10);
    pred._4_4_ = pred._4_4_ + 1;
    if (((*(uint *)(base + 0x18) & 1) != 0) && ((*(uint *)(base + 0x18) & 8) == 0)) {
      if (((long)__addr + 0x10U & 0xf) == 0) {
        local_e8 = 0;
      }
      else {
        local_e8 = 0x10 - ((long)__addr + 0x10U & 0xf) & 0xf;
      }
      pmVar6 = (tbinptr)((long)__addr + local_e8);
      uVar7 = pmVar6->head & 0xfffffffffffffff8;
      if (((pmVar6->head & 3) == 1) &&
         ((long)__addr + (__len - 0x50) <= (long)pmVar6->child + (uVar7 - 0x20))) {
        if (pmVar6 == (tbinptr)m->dv) {
          m->dv = (mchunkptr)0x0;
          m->dvsize = 0;
        }
        else {
          pmVar8 = pmVar6->parent;
          if (pmVar6->bk == pmVar6) {
            CP = pmVar6->child + 1;
            F = pmVar6->child[1];
            if (F == (malloc_tree_chunk *)0x0) {
              CP = pmVar6->child;
              F = pmVar6->child[0];
              if (F == (malloc_tree_chunk *)0x0) goto LAB_0016e679;
            }
            while( true ) {
              H = F->child + 1;
              bVar10 = true;
              if (F->child[1] == (malloc_tree_chunk *)0x0) {
                H = F->child;
                bVar10 = F->child[0] != (malloc_tree_chunk *)0x0;
              }
              if (!bVar10) break;
              CP = H;
              F = *H;
            }
            if (CP < m->least_addr) {
              abort();
            }
            *CP = (tchunkptr)0x0;
          }
          else {
            pmVar2 = pmVar6->fd;
            F = pmVar6->bk;
            bVar10 = false;
            if (((malloc_tree_chunk *)m->least_addr <= pmVar2) &&
               (bVar10 = false, pmVar2->bk == pmVar6)) {
              bVar10 = F->fd == pmVar6;
            }
            if (!bVar10) {
              abort();
            }
            pmVar2->bk = F;
            F->fd = pmVar2;
          }
LAB_0016e679:
          if (pmVar8 != (malloc_tree_chunk *)0x0) {
            if (pmVar6 == m->treebins[pmVar6->index]) {
              m->treebins[pmVar6->index] = F;
              if (F == (tchunkptr)0x0) {
                m->treemap = (1 << ((byte)pmVar6->index & 0x1f) ^ 0xffffffffU) & m->treemap;
              }
            }
            else {
              if (pmVar8 < (malloc_tree_chunk *)m->least_addr) {
                abort();
              }
              if (pmVar8->child[0] == pmVar6) {
                pmVar8->child[0] = F;
              }
              else {
                pmVar8->child[1] = F;
              }
            }
            if (F != (tchunkptr)0x0) {
              if (F < (tchunkptr)m->least_addr) {
                abort();
              }
              F->parent = pmVar8;
              pmVar8 = pmVar6->child[0];
              if (pmVar8 != (malloc_tree_chunk *)0x0) {
                if (pmVar8 < (malloc_tree_chunk *)m->least_addr) {
                  abort();
                }
                F->child[0] = pmVar8;
                pmVar8->parent = F;
              }
              pmVar8 = pmVar6->child[1];
              if (pmVar8 != (malloc_tree_chunk *)0x0) {
                if (pmVar8 < (malloc_tree_chunk *)m->least_addr) {
                  abort();
                }
                F->child[1] = pmVar8;
                pmVar8->parent = F;
              }
            }
          }
        }
        iVar4 = munmap(__addr,__len);
        if (iVar4 == 0) {
          sStack_18 = __len + sStack_18;
          m->footprint = m->footprint - __len;
          base = (char *)sp;
          sp->next = pmVar1;
        }
        else {
          uVar5 = (uint)(uVar7 >> 8);
          if (uVar5 == 0) {
            K = 0;
          }
          else if (uVar5 < 0x10000) {
            K = (0x1f - LZCOUNT(uVar5)) * 2 +
                ((uint)(uVar7 >> ((char)(0x1f - LZCOUNT(uVar5)) + 7U & 0x3f)) & 1);
          }
          else {
            K = 0x1f;
          }
          pmVar8 = (malloc_tree_chunk *)(m->treebins + K);
          pmVar6->index = K;
          pmVar6->child[1] = (malloc_tree_chunk *)0x0;
          pmVar6->child[0] = (malloc_tree_chunk *)0x0;
          if ((m->treemap & 1 << ((byte)K & 0x1f)) == 0) {
            m->treemap = 1 << ((byte)K & 0x1f) | m->treemap;
            pmVar8->prev_foot = (size_t)pmVar6;
            pmVar6->parent = pmVar8;
            pmVar6->bk = pmVar6;
            pmVar6->fd = pmVar6;
          }
          else {
            K_1 = pmVar8->prev_foot;
            if (K == 0x1f) {
              bVar3 = 0;
            }
            else {
              bVar3 = 0x3f - ((char)(K >> 1) + '\x06');
            }
            C = (tchunkptr *)(uVar7 << (bVar3 & 0x3f));
            while ((*(ulong *)(K_1 + 8) & 0xfffffffffffffff8) != uVar7) {
              psVar9 = (size_t *)(K_1 + 0x20 + ((long)C >> 0x3f) * -8);
              C = (tchunkptr *)((long)C << 1);
              if (*psVar9 == 0) {
                if (psVar9 < m->least_addr) {
                  abort();
                }
                *psVar9 = (size_t)pmVar6;
                pmVar6->parent = (malloc_tree_chunk *)K_1;
                pmVar6->bk = pmVar6;
                pmVar6->fd = pmVar6;
                goto LAB_0016eb94;
              }
              K_1 = *psVar9;
            }
            pmVar8 = *(malloc_tree_chunk **)(K_1 + 0x10);
            bVar10 = false;
            if (m->least_addr <= K_1) {
              bVar10 = (malloc_tree_chunk *)m->least_addr <= pmVar8;
            }
            if (!bVar10) {
              abort();
            }
            pmVar8->bk = pmVar6;
            *(tbinptr *)(K_1 + 0x10) = pmVar6;
            pmVar6->fd = pmVar8;
            pmVar6->bk = (malloc_tree_chunk *)K_1;
            pmVar6->parent = (malloc_tree_chunk *)0x0;
          }
        }
      }
    }
LAB_0016eb94:
    sp = (msegmentptr)base;
    base = (char *)pmVar1;
  } while( true );
}

Assistant:

static size_t release_unused_segments(mstate m) {
  size_t released = 0;
  int nsegs = 0;
  msegmentptr pred = &m->seg;
  msegmentptr sp = pred->next;
  while (sp != 0) {
    char* base = sp->base;
    size_t size = sp->size;
    msegmentptr next = sp->next;
    ++nsegs;
    if (is_mmapped_segment(sp) && !is_extern_segment(sp)) {
      mchunkptr p = align_as_chunk(base);
      size_t psize = chunksize(p);
      /* Can unmap if first chunk holds entire segment and not pinned */
      if (!is_inuse(p) && (char*)p + psize >= base + size - TOP_FOOT_SIZE) {
        tchunkptr tp = (tchunkptr)p;
        assert(segment_holds(sp, (char*)sp));
        if (p == m->dv) {
          m->dv = 0;
          m->dvsize = 0;
        }
        else {
          unlink_large_chunk(m, tp);
        }
        if (CALL_MUNMAP(base, size) == 0) {
          released += size;
          m->footprint -= size;
          /* unlink obsoleted record */
          sp = pred;
          sp->next = next;
        }
        else { /* back out if cannot unmap */
          insert_large_chunk(m, tp, psize);
        }
      }
    }
    if (NO_SEGMENT_TRAVERSAL) /* scan only first segment */
      break;
    pred = sp;
    sp = next;
  }
  /* Reset check counter */
  m->release_checks = (((size_t) nsegs > (size_t) MAX_RELEASE_CHECK_RATE)?
                       (size_t) nsegs : (size_t) MAX_RELEASE_CHECK_RATE);
  return released;
}